

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  pointer pcVar1;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (n == 1) {
    local_88 = local_78;
    pcVar1 = (word->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + word->_M_string_length);
  }
  else {
    pcVar1 = (word->_M_dataplus)._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + word->_M_string_length);
    std::__cxx11::string::append((char *)&local_48);
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_48,local_48 + local_40);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_68 + local_60);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_88,local_88 + local_80);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if ((n != 1) && (local_68 != local_58)) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}